

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dreadrb.c
# Opt level: O3

void dreadrb(int *nrow,int *ncol,int_t *nonz,double **nzval,int_t **rowind,int_t **colptr)

{
  long lVar1;
  byte bVar2;
  int iVar3;
  int *addr;
  FILE *__stream;
  uint uVar4;
  int iVar5;
  byte *pbVar6;
  int_t *piVar7;
  int_t *addr_00;
  int_t *addr_01;
  void *addr_02;
  ulong uVar8;
  int_t *piVar9;
  double *pdVar10;
  ulong uVar11;
  uint uVar12;
  int_t *addr_03;
  double *pdVar13;
  double *pdVar14;
  long lVar15;
  double *addr_04;
  int iVar16;
  byte *__nptr;
  long lVar17;
  ulong uVar18;
  long lVar19;
  int iVar20;
  double dVar21;
  int tmp;
  int rowsize;
  int rownum;
  int colsize;
  int colnum;
  char type [4];
  char buf_1 [100];
  char buf [100];
  int local_248;
  int local_21c;
  double **local_218;
  int_t **local_210;
  int_t **local_208;
  int_t *local_200;
  double *local_1f8;
  double *local_1f0;
  int local_1e4;
  int local_1e0;
  int local_1dc;
  int local_1d8;
  undefined1 local_1d4;
  byte local_1d3;
  undefined1 local_1d1;
  int_t *local_1d0;
  ulong local_1c8;
  long local_1c0;
  double *local_1b8;
  int_t *local_1b0;
  double *local_1a8;
  int_t *local_1a0;
  byte local_198 [256];
  byte local_98 [14];
  undefined1 local_8a;
  
  __stream = _stdin;
  local_218 = nzval;
  local_210 = rowind;
  local_208 = colptr;
  fgets((char *)local_98,100,_stdin);
  fputs((char *)local_98,_stdout);
  iVar20 = 4;
  iVar16 = 0;
  do {
    __isoc99_fscanf(__stream,"%14c",local_98);
    local_8a = 0;
    __isoc99_sscanf(local_98,"%d",&local_21c);
    if (iVar20 == 1) {
      iVar16 = local_21c;
    }
    iVar20 = iVar20 + -1;
  } while (iVar20 != 0);
  do {
    iVar20 = fgetc(__stream);
  } while (iVar20 != 10);
  __isoc99_fscanf(__stream,"%3c",&local_1d4);
  pbVar6 = local_98;
  __isoc99_fscanf(__stream,"%11c",pbVar6);
  local_1d1 = 0;
  __isoc99_fscanf(__stream,"%14c",pbVar6);
  iVar20 = atoi((char *)pbVar6);
  *nrow = iVar20;
  __isoc99_fscanf(__stream,"%14c",pbVar6);
  iVar20 = atoi((char *)pbVar6);
  *ncol = iVar20;
  __isoc99_fscanf(__stream,"%14c",pbVar6);
  iVar20 = atoi((char *)pbVar6);
  *nonz = iVar20;
  __isoc99_fscanf(__stream,"%14c",pbVar6);
  local_21c = atoi((char *)pbVar6);
  if (local_21c != 0) {
    puts("This is not an assembled matrix!");
  }
  if (*nrow != *ncol) {
    puts("Matrix is not square.");
  }
  do {
    iVar20 = fgetc(__stream);
  } while (iVar20 != 10);
  dallocateA(*ncol,*nonz,local_218,local_210,local_208);
  __isoc99_fscanf(__stream,"%16c",pbVar6);
  dParseIntFormat((char *)pbVar6,&local_1d8,&local_1dc);
  __isoc99_fscanf(__stream,"%16c",pbVar6);
  dParseIntFormat((char *)pbVar6,&local_1e0,&local_1e4);
  __isoc99_fscanf(__stream,"%20c",pbVar6);
  do {
    bVar2 = *pbVar6;
    pbVar6 = pbVar6 + 1;
  } while (bVar2 != 0x28);
  local_248 = atoi((char *)pbVar6);
  while( true ) {
    do {
      __nptr = pbVar6 + 1;
      uVar4 = *pbVar6 - 0x44;
      pbVar6 = __nptr;
    } while (0x2c < uVar4);
    if ((0x700000007U >> ((ulong)uVar4 & 0x3f) & 1) != 0) break;
    if ((0x100000001000U >> ((ulong)uVar4 & 0x3f) & 1) != 0) {
      local_248 = atoi((char *)__nptr);
    }
  }
  for (; (*pbVar6 != 0x29 && (*pbVar6 != 0x2e)); pbVar6 = pbVar6 + 1) {
  }
  *pbVar6 = 0;
  uVar4 = atoi((char *)__nptr);
  do {
    iVar20 = fgetc(__stream);
  } while (iVar20 != 10);
  ReadVector((FILE *)__stream,*ncol + 1,*local_208,local_1d8,local_1dc);
  ReadVector((FILE *)__stream,*nonz,*local_210,local_1e0,local_1e4);
  if (iVar16 != 0) {
    iVar16 = *nonz;
    if (0 < (long)iVar16) {
      local_1f0 = *local_218;
      local_1f8 = (double *)(long)local_248;
      lVar17 = 0;
      do {
        fgets((char *)local_198,100,__stream);
        if (0 < local_248) {
          lVar17 = (long)(int)lVar17;
          uVar12 = 0;
          lVar19 = 0;
          do {
            lVar1 = lVar19 + 1;
            lVar15 = lVar1 * (int)uVar4;
            bVar2 = local_198[lVar15];
            local_198[lVar15] = 0;
            if (0 < (int)uVar4) {
              uVar11 = 0;
              do {
                if ((local_198[uVar11 + uVar12] | 0x20) == 100) {
                  local_198[uVar11 + uVar12] = 0x45;
                }
                uVar11 = uVar11 + 1;
              } while (uVar4 != uVar11);
            }
            dVar21 = atof((char *)(local_198 + lVar19 * (int)uVar4));
            local_1f0[lVar17] = dVar21;
            lVar17 = lVar17 + 1;
            local_198[lVar15] = bVar2;
          } while ((lVar1 < (long)local_1f8) &&
                  (uVar12 = uVar12 + uVar4, lVar19 = lVar1, lVar17 < iVar16));
        }
      } while ((int)lVar17 < iVar16);
    }
  }
  if ((local_1d3 & 0xdf) == 0x53) {
    uVar4 = *ncol;
    addr_03 = *local_210;
    addr = *local_208;
    addr_04 = *local_218;
    iVar16 = uVar4 + 1;
    piVar7 = intMalloc(iVar16);
    if (piVar7 == (int_t *)0x0) {
      sprintf((char *)local_198,"%s at line %d in file %s\n","SUPERLU_MALLOC fails for marker[]",
              0xc9,
              "/workspace/llm4binary/github/license_c_cmakelists/xiaoyeli[P]superlu/SRC/dreadrb.c");
      superlu_abort_and_exit((char *)local_198);
    }
    local_1c8 = (ulong)uVar4;
    addr_00 = intMalloc(iVar16);
    local_200 = addr_00;
    if (addr_00 == (int_t *)0x0) {
      sprintf((char *)local_198,"%s at line %d in file %s\n","SUPERLU_MALLOC t_colptr[]",0xcb,
              "/workspace/llm4binary/github/license_c_cmakelists/xiaoyeli[P]superlu/SRC/dreadrb.c");
      addr_00 = local_200;
      superlu_abort_and_exit((char *)local_198);
    }
    addr_01 = intMalloc(*nonz);
    if (addr_01 == (int_t *)0x0) {
      sprintf((char *)local_198,"%s at line %d in file %s\n","SUPERLU_MALLOC fails for t_rowind[]",
              0xcd,
              "/workspace/llm4binary/github/license_c_cmakelists/xiaoyeli[P]superlu/SRC/dreadrb.c");
      addr_00 = local_200;
      superlu_abort_and_exit((char *)local_198);
    }
    addr_02 = superlu_malloc((long)*nonz << 3);
    local_1d0 = piVar7;
    if (addr_02 == (void *)0x0) {
      sprintf((char *)local_198,"%s at line %d in file %s\n","SUPERLU_MALLOC fails for t_val[]",0xcf
              ,"/workspace/llm4binary/github/license_c_cmakelists/xiaoyeli[P]superlu/SRC/dreadrb.c")
      ;
      piVar7 = local_1d0;
      superlu_abort_and_exit((char *)local_198);
    }
    uVar11 = local_1c8;
    iVar20 = (int)local_1c8;
    if (iVar20 < 1) {
      *addr_00 = 0;
    }
    else {
      uVar18 = 0;
      memset(piVar7,0,local_1c8 * 4);
      iVar5 = *addr;
      do {
        lVar17 = uVar18 + 1;
        uVar18 = uVar18 + 1;
        iVar3 = addr[lVar17];
        if (iVar5 < addr[lVar17]) {
          lVar17 = (long)iVar5;
          do {
            piVar7[addr_03[lVar17]] = piVar7[addr_03[lVar17]] + 1;
            lVar17 = lVar17 + 1;
            iVar3 = addr[uVar18];
          } while (lVar17 < addr[uVar18]);
        }
        iVar5 = iVar3;
      } while (uVar18 != uVar11);
      *local_200 = 0;
      uVar18 = 0;
      do {
        local_200[uVar18 + 1] = piVar7[uVar18] + local_200[uVar18];
        piVar7[uVar18] = local_200[uVar18];
        uVar18 = uVar18 + 1;
      } while (uVar11 != uVar18);
      iVar5 = *addr;
      uVar18 = 0;
      do {
        uVar8 = uVar18 + 1;
        iVar3 = addr[uVar18 + 1];
        if (iVar5 < addr[uVar18 + 1]) {
          lVar17 = (long)iVar5;
          do {
            iVar5 = addr_03[lVar17];
            addr_01[piVar7[iVar5]] = (int_t)uVar18;
            iVar3 = piVar7[iVar5];
            *(double *)((long)addr_02 + (long)iVar3 * 8) = addr_04[lVar17];
            piVar7[iVar5] = iVar3 + 1;
            lVar17 = lVar17 + 1;
            iVar3 = addr[uVar8];
          } while (lVar17 < addr[uVar8]);
        }
        iVar5 = iVar3;
        uVar18 = uVar8;
        addr_00 = local_200;
      } while (uVar8 != uVar11);
    }
    lVar17 = (long)*nonz * 2 - (long)iVar20;
    piVar7 = intMalloc(iVar16);
    if (piVar7 == (int_t *)0x0) {
      sprintf((char *)local_198,"%s at line %d in file %s\n","SUPERLU_MALLOC a_colptr[]",0xe8,
              "/workspace/llm4binary/github/license_c_cmakelists/xiaoyeli[P]superlu/SRC/dreadrb.c");
      superlu_abort_and_exit((char *)local_198);
    }
    piVar9 = intMalloc((int_t)lVar17);
    if (piVar9 == (int_t *)0x0) {
      sprintf((char *)local_198,"%s at line %d in file %s\n","SUPERLU_MALLOC fails for a_rowind[]",
              0xea,
              "/workspace/llm4binary/github/license_c_cmakelists/xiaoyeli[P]superlu/SRC/dreadrb.c");
      superlu_abort_and_exit((char *)local_198);
    }
    local_1c0 = lVar17;
    pdVar10 = (double *)superlu_malloc(lVar17 * 8);
    if (pdVar10 == (double *)0x0) {
      sprintf((char *)local_198,"%s at line %d in file %s\n","SUPERLU_MALLOC fails for a_val[]",0xec
              ,"/workspace/llm4binary/github/license_c_cmakelists/xiaoyeli[P]superlu/SRC/dreadrb.c")
      ;
      superlu_abort_and_exit((char *)local_198);
    }
    *piVar7 = 0;
    if (0 < iVar20) {
      pdVar14 = (double *)0x0;
      uVar18 = 0;
      local_1b8 = addr_04;
      local_1b0 = addr_03;
      local_1a0 = addr_01;
      do {
        lVar17 = (long)addr_00[uVar18];
        uVar8 = uVar18 + 1;
        iVar16 = addr_00[uVar18 + 1];
        if (addr_00[uVar18] < iVar16) {
          do {
            if (uVar18 != (uint)local_1a0[lVar17]) {
              iVar16 = (int)pdVar14;
              piVar9[iVar16] = local_1a0[lVar17];
              pdVar10[iVar16] = *(double *)((long)addr_02 + lVar17 * 8);
              pdVar14 = (double *)(ulong)(iVar16 + 1);
              iVar16 = addr_00[uVar8];
            }
            lVar17 = lVar17 + 1;
          } while (lVar17 < iVar16);
        }
        lVar17 = (long)addr[uVar18];
        if (addr[uVar18] < addr[uVar8]) {
          pdVar13 = pdVar10 + (int)pdVar14;
          lVar19 = 0;
          local_1f8 = pdVar13;
          local_1f0 = pdVar14;
          local_1a8 = pdVar14;
          do {
            piVar9[(int)pdVar14 + lVar19] = addr_03[lVar17 + lVar19];
            dVar21 = addr_04[lVar17 + lVar19];
            pdVar13[lVar19] = dVar21;
            if (ABS(dVar21) < 4.047e-300) {
              printf("%5d: %e\n",(ulong)(uint)((int)local_1f0 + (int)lVar19));
              pdVar13 = local_1f8;
            }
            lVar1 = lVar17 + lVar19;
            lVar19 = lVar19 + 1;
          } while (lVar1 + 1 < (long)addr[uVar8]);
          pdVar14 = (double *)(ulong)(uint)((int)local_1a8 + (int)lVar19);
          uVar11 = local_1c8;
          addr_03 = local_1b0;
          addr_04 = local_1b8;
          addr_00 = local_200;
        }
        piVar7[uVar8] = (int_t)pdVar14;
        uVar18 = uVar8;
        addr_01 = local_1a0;
      } while (uVar8 != uVar11);
    }
    lVar17 = local_1c0;
    printf("FormFullA: new_nnz = %lld\n",local_1c0);
    superlu_free(addr_04);
    superlu_free(addr_03);
    superlu_free(addr);
    superlu_free(local_1d0);
    superlu_free(addr_02);
    superlu_free(addr_01);
    superlu_free(addr_00);
    *local_218 = pdVar10;
    *local_210 = piVar9;
    *local_208 = piVar7;
    *nonz = (int_t)lVar17;
  }
  fclose(__stream);
  return;
}

Assistant:

void
dreadrb(int *nrow, int *ncol, int_t *nonz,
        double **nzval, int_t **rowind, int_t **colptr)
{

    register int i, numer_lines = 0;
    int tmp, colnum, colsize, rownum, rowsize, valnum, valsize;
    char buf[100], type[4];
    int sym;
    FILE *fp;

    fp = stdin;

    /* Line 1 */
    fgets(buf, 100, fp);
    fputs(buf, stdout);

    /* Line 2 */
    for (i=0; i<4; i++) {
        fscanf(fp, "%14c", buf); buf[14] = 0;
        sscanf(buf, "%d", &tmp);
        if (i == 3) numer_lines = tmp;
    }
    dDumpLine(fp);

    /* Line 3 */
    fscanf(fp, "%3c", type);
    fscanf(fp, "%11c", buf); /* pad */
    type[3] = 0;
#ifdef DEBUG
    printf("Matrix type %s\n", type);
#endif

    fscanf(fp, "%14c", buf); *nrow = atoi(buf);
    fscanf(fp, "%14c", buf); *ncol = atoi(buf);
    fscanf(fp, "%14c", buf); *nonz = atoi(buf);
    fscanf(fp, "%14c", buf); tmp = atoi(buf);

    if (tmp != 0)
        printf("This is not an assembled matrix!\n");
    if (*nrow != *ncol)
        printf("Matrix is not square.\n");
    dDumpLine(fp);

    /* Allocate storage for the three arrays ( nzval, rowind, colptr ) */
    dallocateA(*ncol, *nonz, nzval, rowind, colptr);

    /* Line 4: format statement */
    fscanf(fp, "%16c", buf);
    dParseIntFormat(buf, &colnum, &colsize);
    fscanf(fp, "%16c", buf);
    dParseIntFormat(buf, &rownum, &rowsize);
    fscanf(fp, "%20c", buf);
    dParseFloatFormat(buf, &valnum, &valsize);
    dDumpLine(fp);

#ifdef DEBUG
    printf("%d rows, %lld nonzeros\n", *nrow, (long long) *nonz);
    printf("colnum %d, colsize %d\n", colnum, colsize);
    printf("rownum %d, rowsize %d\n", rownum, rowsize);
    printf("valnum %d, valsize %d\n", valnum, valsize);
#endif

    ReadVector(fp, *ncol+1, *colptr, colnum, colsize);
    ReadVector(fp, *nonz, *rowind, rownum, rowsize);
    if ( numer_lines ) {
        dReadValues(fp, *nonz, *nzval, valnum, valsize);
    }

    sym = (type[1] == 'S' || type[1] == 's');
    if ( sym ) {
	FormFullA(*ncol, nonz, nzval, rowind, colptr);
    }

    fclose(fp);
}